

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

void __thiscall smf::Option_register::~Option_register(Option_register *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->m_modifiedOption)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_modifiedOption).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_defaultOption)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_defaultOption).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_description)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_description).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_definition)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_definition).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Option_register::~Option_register() {
	// do nothing
}